

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

CborError jsonValueToCbor(CborEncoder *parent,QJsonValue *v)

{
  CborEncoder *__x;
  double dVar1;
  Type TVar2;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  double d;
  QByteArray s;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CborEncoder *in_stack_ffffffffffffff60;
  CborEncoder *encoder;
  QJsonArray *in_stack_ffffffffffffff68;
  CborEncoder *in_stack_ffffffffffffff70;
  QJsonValue *in_stack_ffffffffffffff78;
  CborError local_4c;
  QByteArray local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QJsonValue::type((QJsonValue *)0x11a52c);
  if (TVar2 != Null) {
    if (TVar2 == Bool) {
      QJsonValue::toBool((QJsonValue *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                         ,false);
      local_4c = cbor_encode_boolean(in_stack_ffffffffffffff60,
                                     SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
      goto LAB_0011a77b;
    }
    if (TVar2 == Double) {
      __x = (CborEncoder *)
            QJsonValue::toDouble
                      ((QJsonValue *)in_stack_ffffffffffffff60,
                       (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      encoder = __x;
      dVar1 = floor((double)__x);
      if ((((double)encoder != dVar1) || (NAN((double)encoder) || NAN(dVar1))) ||
         (9007199254740992.0 < ABS((double)__x))) {
        local_4c = cbor_encode_double(encoder,(double)in_stack_ffffffffffffff68);
      }
      else {
        local_4c = cbor_encode_int(in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68);
      }
      goto LAB_0011a77b;
    }
    if (TVar2 == String) {
      local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_30.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QJsonValue::toString(in_stack_ffffffffffffff78);
      QString::toUtf8((QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x11a6a8);
      QByteArray::constData((QByteArray *)0x11a6bc);
      QByteArray::size(&local_30);
      local_4c = cbor_encode_text_string
                           (in_stack_ffffffffffffff60,
                            (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            0x11a6dd);
      QByteArray::~QByteArray((QByteArray *)0x11a6eb);
      goto LAB_0011a77b;
    }
    if (TVar2 == Array) {
      QJsonValue::toArray(in_stack_ffffffffffffff78);
      local_4c = jsonArrayToCbor(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QJsonArray::~QJsonArray((QJsonArray *)0x11a60d);
      goto LAB_0011a77b;
    }
    if (TVar2 == Object) {
      QJsonValue::toObject(in_RDI);
      local_4c = jsonObjectToCbor(in_stack_ffffffffffffff70,(QJsonObject *)in_stack_ffffffffffffff68
                                 );
      QJsonObject::~QJsonObject((QJsonObject *)0x11a651);
      goto LAB_0011a77b;
    }
    if (TVar2 != Undefined) goto LAB_0011a77b;
  }
  local_4c = cbor_encode_null((CborEncoder *)0x11a596);
LAB_0011a77b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

static CborError jsonValueToCbor(CborEncoder *parent, const QJsonValue &v)
{
    switch (v.type()) {
    case QJsonValue::Null:
    case QJsonValue::Undefined:
        return cbor_encode_null(parent);
    case QJsonValue::Bool:
        return cbor_encode_boolean(parent, v.toBool());
    case QJsonValue::Array:
        return jsonArrayToCbor(parent, v.toArray());
    case QJsonValue::Object:
        return jsonObjectToCbor(parent, v.toObject());
    case QJsonValue::String: {
        QByteArray s = v.toString().toUtf8();
        return cbor_encode_text_string(parent, s.constData(), s.size());
    }
    case QJsonValue::Double: {
        double d = v.toDouble();
        if (d == floor(d) && fabs(d) <= (Q_INT64_C(1) << std::numeric_limits<double>::digits))
            return cbor_encode_int(parent, qint64(d));
        return cbor_encode_double(parent, d);
    }
    }
    Q_UNREACHABLE_RETURN(CborUnknownError);
}